

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

char * sam_hdr_PG_ID(SAM_hdr *sh,char *name)

{
  khint_t kVar1;
  khint_t k;
  char *name_local;
  SAM_hdr *sh_local;
  
  kVar1 = kh_get_m_s2i(sh->pg_hash,name);
  sh_local = (SAM_hdr *)name;
  if (kVar1 != sh->pg_hash->n_buckets) {
    do {
      sh->ID_cnt = sh->ID_cnt + 1;
      sprintf(sh->ID_buf,"%.1000s.%d",name);
      kVar1 = kh_get_m_s2i(sh->pg_hash,sh->ID_buf);
    } while (kVar1 == sh->pg_hash->n_buckets);
    sh_local = (SAM_hdr *)sh->ID_buf;
  }
  return (char *)sh_local;
}

Assistant:

const char *sam_hdr_PG_ID(SAM_hdr *sh, const char *name) {
    khint_t k = kh_get(m_s2i, sh->pg_hash, name);
    if (k == kh_end(sh->pg_hash))
	return name;

    do {
	sprintf(sh->ID_buf, "%.1000s.%d", name, sh->ID_cnt++);
	k = kh_get(m_s2i, sh->pg_hash, sh->ID_buf);
    } while (k == kh_end(sh->pg_hash));

    return sh->ID_buf;
}